

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::StreamingReporterBase<Catch::ConsoleReporter>::testRunStarting
          (StreamingReporterBase<Catch::ConsoleReporter> *this,TestRunInfo *_testRunInfo)

{
  char *pcVar1;
  pointer pcVar2;
  
  Option<Catch::TestRunInfo>::reset(&(this->currentTestRunInfo).super_Option<Catch::TestRunInfo>);
  pcVar1 = (this->currentTestRunInfo).super_Option<Catch::TestRunInfo>.storage;
  *(char **)(this->currentTestRunInfo).super_Option<Catch::TestRunInfo>.storage =
       (this->currentTestRunInfo).super_Option<Catch::TestRunInfo>.storage + 0x10;
  pcVar2 = (_testRunInfo->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)pcVar1,pcVar2,pcVar2 + (_testRunInfo->name)._M_string_length);
  (this->currentTestRunInfo).super_Option<Catch::TestRunInfo>.nullableValue = (TestRunInfo *)pcVar1;
  (this->currentTestRunInfo).used = false;
  return;
}

Assistant:

void testRunStarting(TestRunInfo const& _testRunInfo) override {
            currentTestRunInfo = _testRunInfo;
        }